

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

green_future_t green_future_init(green_loop_t_conflict loop)

{
  green_future_t pgVar1;
  
  if (loop != (green_loop_t_conflict)0x0) {
    pgVar1 = (green_future_t)green_malloc(0x38);
    pgVar1->loop = loop;
    pgVar1->state = green_future_pending;
    pgVar1->refs = 1;
    pgVar1->slot = -1;
    return pgVar1;
  }
  return (green_future_t)0x0;
}

Assistant:

green_future_t green_future_init(green_loop_t loop)
{
    if (loop == NULL) {
        return NULL;
    }
    green_future_t future = green_malloc(sizeof(struct green_future));
    future->loop = loop;
    future->state = green_future_pending;
    future->refs = 1;
    future->slot = -1;
    return future;
}